

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O2

string * google::protobuf::internal::(anonymous_namespace)::MutableUnknownFields_abi_cxx11_
                   (MessageLite *msg,int64 arena_offset)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  uVar1 = *(ulong *)((long)&msg->_vptr_MessageLite + arena_offset);
  if ((uVar1 & 1) != 0) {
    return (string *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  pbVar2 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                     ((InternalMetadata *)((long)&msg->_vptr_MessageLite + arena_offset));
  return pbVar2;
}

Assistant:

std::string* MutableUnknownFields(MessageLite* msg, int64 arena_offset) {
  return Raw<InternalMetadata>(msg, arena_offset)
      ->mutable_unknown_fields<std::string>();
}